

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

string * __thiscall
vkt::SpirVAssembly::getRandomConstantString_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,NumberType type,Random *rnd)

{
  deUint32 dVar1;
  undefined4 in_register_00000014;
  deRandom *rnd_00;
  int iVar2;
  float number;
  
  rnd_00 = (deRandom *)CONCAT44(in_register_00000014,type);
  iVar2 = (int)this;
  if (iVar2 == 2) {
    number = deRandom_getFloat(rnd_00);
    numberToString<float>(__return_storage_ptr__,number);
  }
  else if (iVar2 == 1) {
    dVar1 = deRandom_getUint32(rnd_00);
    numberToString<unsigned_int>(__return_storage_ptr__,dVar1);
  }
  else if (iVar2 == 0) {
    dVar1 = deRandom_getUint32(rnd_00);
    numberToString<int>(__return_storage_ptr__,dVar1);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

const string getRandomConstantString (const NumberType type, de::Random& rnd)
{
	if (type == TYPE_INT)
	{
		return numberToString<deInt32>(getInt(rnd));
	}
	else if (type == TYPE_UINT)
	{
		return numberToString<deUint32>(rnd.getUint32());
	}
	else if (type == TYPE_FLOAT)
	{
		return numberToString<float>(rnd.getFloat());
	}
	else
	{
		DE_ASSERT(false);
		return "";
	}
}